

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall
helics::apps::Player::addEndpoint(Player *this,string_view endpointName,string_view endpointType)

{
  _Map_pointer ppEVar1;
  _Map_pointer ppEVar2;
  _Elt_pointer pEVar3;
  Endpoint *pEVar4;
  _Elt_pointer pEVar5;
  iterator iVar6;
  size_type sVar7;
  string *psVar8;
  mapped_type *pmVar9;
  Endpoint *pEVar10;
  ulong uVar11;
  InterfaceVisibility local_4c;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  key_type local_38;
  key_type local_28;
  
  local_48._M_str = endpointType._M_str;
  local_48._M_len = endpointType._M_len;
  local_38._M_str = endpointName._M_str;
  local_38._M_len = endpointName._M_len;
  iVar6 = CLI::std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->eptids)._M_h,&local_38);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Endpoint already exists\n",0x18);
    return;
  }
  if ((this->super_App).useLocal != false) {
    sVar7 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&local_38,"./",0,2);
    if (sVar7 == 0xffffffffffffffff) {
      local_28._M_len =
           (size_t)(this->super_App).fed.
                   super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
      emplace_back<helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,
                 (CombinationFederate **)&local_28,&local_38,&local_48);
      goto LAB_001c4d4c;
    }
  }
  local_4c = GLOBAL;
  local_28._M_len =
       (size_t)(this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
  emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,&local_4c,
             (CombinationFederate **)&local_28,&local_38,&local_48);
LAB_001c4d4c:
  ppEVar1 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppEVar2 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pEVar3 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  pEVar10 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pEVar4 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_first;
  uVar11 = (long)pEVar10 - (long)pEVar4;
  pEVar5 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pEVar10 == pEVar4) {
    pEVar10 = ppEVar1[-1] + 4;
  }
  psVar8 = Interface::getName_abi_cxx11_(&pEVar10[-1].super_Interface);
  local_28._M_str = (psVar8->_M_dataplus)._M_p;
  local_28._M_len = psVar8->_M_string_length;
  pmVar9 = CLI::std::__detail::
           _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->eptids,&local_28);
  *pmVar9 = (int)((ulong)((long)pEVar3 - (long)pEVar5) >> 3) * -0x11111111 +
            (int)(uVar11 >> 3) * -0x11111111 +
            ((int)((ulong)((long)ppEVar1 - (long)ppEVar2) >> 3) + -1 +
            (uint)(ppEVar1 == (_Map_pointer)0x0)) * 4 + -1;
  return;
}

Assistant:

void Player::addEndpoint(std::string_view endpointName, std::string_view endpointType)
{
    // skip already existing publications
    if (eptids.find(endpointName) != eptids.end()) {
        std::cerr << "Endpoint already exists\n";
        return;
    }
    if (!useLocal) {
        endpoints.emplace_back(helics::InterfaceVisibility::GLOBAL,
                               fed.get(),
                               endpointName,
                               endpointType);
    } else {
        auto kp = endpointName.find_first_of("./");
        if (kp == std::string::npos) {
            endpoints.emplace_back(fed.get(), endpointName, endpointType);
        } else {
            endpoints.emplace_back(helics::InterfaceVisibility::GLOBAL,
                                   fed.get(),
                                   endpointName,
                                   endpointType);
        }
    }
    eptids[endpoints.back().getName()] = static_cast<int>(endpoints.size()) - 1;
}